

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool parse_node_id(VrplibParser *p,char *lexeme,int32_t node_id)

{
  _Bool _Var1;
  int32_t value;
  uint local_1c;
  
  local_1c = 0;
  _Var1 = str_to_int32(lexeme,(int32_t *)&local_1c);
  if (_Var1) {
    _Var1 = true;
    if (local_1c != node_id + 1U) {
      _Var1 = false;
      parse_error(p,"Expected node id to be `%d`. Got `%d` instead",(ulong)(node_id + 1U));
    }
  }
  else {
    _Var1 = false;
    parse_error(p,"Failed to retrieve integer");
  }
  return _Var1;
}

Assistant:

static bool parse_node_id(VrplibParser *p, char *lexeme, int32_t node_id) {
    int32_t value = 0;
    if (!str_to_int32(lexeme, &value)) {
        parse_error(p, "Failed to retrieve integer");
        return false;
    }

    if (value != node_id + 1) {
        parse_error(p, "Expected node id to be `%d`. Got `%d` instead",
                    node_id + 1, value);
        return false;
    }

    return true;
}